

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O3

bool __thiscall
cmFortranParser_s::FindIncludeFile
          (cmFortranParser_s *this,char *dir,char *includeName,string *fileName)

{
  char *pcVar1;
  pointer pbVar2;
  bool bVar3;
  pointer pbVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string fullName;
  string local_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d0;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  size_t local_a0;
  char *local_98;
  undefined8 local_90;
  string local_88;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  bVar3 = cmsys::SystemTools::FileIsFullPath(includeName);
  if (bVar3) {
    pcVar1 = (char *)fileName->_M_string_length;
    strlen(includeName);
    std::__cxx11::string::_M_replace((ulong)fileName,0,pcVar1,(ulong)includeName);
    bVar3 = cmsys::SystemTools::FileExists(fileName,true);
    return bVar3;
  }
  local_d0.first._M_len = strlen(dir);
  local_d0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68 = 0;
  local_60 = 1;
  local_50[0] = 0x2f;
  local_b8 = 1;
  local_a8 = 0;
  local_d0.first._M_str = dir;
  local_b0 = local_50;
  local_58 = local_50;
  local_a0 = strlen(includeName);
  local_90 = 0;
  views._M_len = 3;
  views._M_array = &local_d0;
  local_98 = includeName;
  cmCatViews(&local_f0,views);
  bVar3 = cmsys::SystemTools::FileExists(&local_f0,true);
  if (bVar3) {
    bVar3 = true;
    std::__cxx11::string::_M_assign((string *)fileName);
  }
  else {
    pbVar2 = (this->IncludePath).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (this->IncludePath).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1)
    {
      local_d0.first._M_str = (pbVar4->_M_dataplus)._M_p;
      local_d0.first._M_len = pbVar4->_M_string_length;
      local_d0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_68 = 0;
      local_60 = 1;
      local_50[0] = 0x2f;
      local_b8 = 1;
      local_a8 = 0;
      local_b0 = local_50;
      local_58 = local_50;
      local_a0 = strlen(includeName);
      local_90 = 0;
      views_00._M_len = 3;
      views_00._M_array = &local_d0;
      local_98 = includeName;
      cmCatViews(&local_88,views_00);
      std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      bVar3 = cmsys::SystemTools::FileExists(&local_f0,true);
      if (bVar3) {
        bVar3 = true;
        std::__cxx11::string::_M_assign((string *)fileName);
        goto LAB_001aed60;
      }
    }
    bVar3 = false;
  }
LAB_001aed60:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmFortranParser_s::FindIncludeFile(const char* dir,
                                        const char* includeName,
                                        std::string& fileName)
{
  // If the file is a full path, include it directly.
  if (cmSystemTools::FileIsFullPath(includeName)) {
    fileName = includeName;
    return cmSystemTools::FileExists(fileName, true);
  }
  // Check for the file in the directory containing the including
  // file.
  std::string fullName = cmStrCat(dir, '/', includeName);
  if (cmSystemTools::FileExists(fullName, true)) {
    fileName = fullName;
    return true;
  }

  // Search the include path for the file.
  for (std::string const& i : this->IncludePath) {
    fullName = cmStrCat(i, '/', includeName);
    if (cmSystemTools::FileExists(fullName, true)) {
      fileName = fullName;
      return true;
    }
  }
  return false;
}